

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  pointer pcVar1;
  string *psVar2;
  ostream *poVar3;
  string filename;
  cmGeneratedFileStream fout;
  string local_2a8;
  string local_288;
  undefined1 local_268 [584];
  
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)&local_288);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_268,&local_288,false,None);
  if (((byte)(*(_func_int **)(local_268._0_8_ + -0x18))[(long)(local_268 + 0x20)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"{\n\t\"name\": \"",0xc)
    ;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_268,(this->ProjectName)._M_dataplus._M_p,
                        (this->ProjectName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n\t\"directory\": \"",0x12);
    psVar2 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\",\n\t\"files\": [ { ",0x11);
    GenerateFilesString_abi_cxx11_(&local_2a8,this,lg);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"} ],\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_268,"}\n",2);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}